

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O2

void __thiscall fasttext::ProductQuantizer::load(ProductQuantizer *this,istream *in)

{
  pointer pfVar1;
  long lVar2;
  int i;
  ulong uVar3;
  
  std::istream::read((char *)in,(long)&this->dim_);
  std::istream::read((char *)in,(long)&this->nsubq_);
  std::istream::read((char *)in,(long)&this->dsub_);
  std::istream::read((char *)in,(long)&this->lastdsub_);
  std::vector<float,_std::allocator<float>_>::resize
            (&this->centroids_,(long)this->ksub_ * (long)this->dim_);
  lVar2 = 0;
  for (uVar3 = 0;
      pfVar1 = (this->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->centroids_).super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pfVar1 >> 2);
      uVar3 = uVar3 + 1) {
    std::istream::read((char *)in,(long)pfVar1 + lVar2);
    lVar2 = lVar2 + 4;
  }
  return;
}

Assistant:

void ProductQuantizer::load(std::istream& in) {
  in.read((char*)&dim_, sizeof(dim_));
  in.read((char*)&nsubq_, sizeof(nsubq_));
  in.read((char*)&dsub_, sizeof(dsub_));
  in.read((char*)&lastdsub_, sizeof(lastdsub_));
  centroids_.resize(dim_ * ksub_);
  for (auto i = 0; i < centroids_.size(); i++) {
    in.read((char*)&centroids_[i], sizeof(real));
  }
}